

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2780404::GetSseSum16x16DualTest_RefMseSum_Test::TestBody
          (GetSseSum16x16DualTest_RefMseSum_Test *this)

{
  undefined8 *puVar1;
  GetSseSum16x16DualTest *pGVar2;
  ACMRandom *this_00;
  long lVar3;
  uint32_t uVar4;
  int iVar5;
  int source_stride;
  long lVar6;
  int iVar7;
  uint *puVar8;
  SEARCH_METHODS *pSVar9;
  uint *puVar10;
  uint32_t *var16x16;
  long lVar11;
  uint32_t *sse16x16;
  uint16_t in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4c0;
  AssertHelper local_4b8;
  RegisterStateCheckMMX reg_check_mmx;
  int sum_tot_simd;
  int sum_tot_c;
  uint sse_tot_simd;
  uint sse_tot_c;
  GetSseSum16x16DualTest_RefMseSum_Test *local_480;
  int local_478;
  int local_474;
  ACMRandom *local_470;
  long local_468;
  long local_460;
  long local_458;
  long local_450;
  uint *local_448;
  uint *local_440;
  uint var2 [64];
  uint var1 [64];
  uint sse2 [64];
  uint sse1 [64];
  
  local_470 = &(this->super_GetSseSum16x16DualTest).rnd_;
  local_478 = 0;
  local_480 = this;
  do {
    this_00 = local_470;
    if (0 < (this->super_GetSseSum16x16DualTest).params_.block_size) {
      lVar6 = 0;
      do {
        uVar4 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
        (this->super_GetSseSum16x16DualTest).src_[lVar6] = (uint8_t)(uVar4 >> 0x17);
        uVar4 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
        (this->super_GetSseSum16x16DualTest).ref_[lVar6] = (uint8_t)(uVar4 >> 0x17);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (this->super_GetSseSum16x16DualTest).params_.block_size);
    }
    memset(sse1,0,0x100);
    memset(sse2,0,0x100);
    memset(var1,0,0x100);
    memset(var2,0,0x100);
    sse_tot_c = 0;
    sse_tot_simd = 0;
    sum_tot_c = 0;
    sum_tot_simd = 0;
    if (0 < (this->super_GetSseSum16x16DualTest).params_.height) {
      local_468 = (long)(this->super_GetSseSum16x16DualTest).params_.width;
      local_460 = local_468 << 4;
      lVar11 = 0;
      lVar6 = 0;
      iVar5 = 0;
      do {
        lVar3 = local_468;
        pGVar2 = &this->super_GetSseSum16x16DualTest;
        this = local_480;
        local_458 = lVar6;
        local_450 = lVar11;
        if (0 < (pGVar2->params_).width) {
          var16x16 = var2 + iVar5;
          sse16x16 = sse2 + iVar5;
          puVar10 = var1 + iVar5;
          puVar8 = sse1 + iVar5;
          iVar7 = 0;
          do {
            reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
            reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
            source_stride = (int)lVar3;
            reg_check_mmx.pre_fpu_env_[0] = in_FPUControlWord;
            reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
            local_474 = iVar5;
            local_448 = puVar10;
            local_440 = puVar8;
            (*(this->super_GetSseSum16x16DualTest).params_.func)
                      ((this->super_GetSseSum16x16DualTest).src_ + lVar11,source_stride,
                       (this->super_GetSseSum16x16DualTest).ref_ + lVar11,source_stride,puVar8,
                       &sse_tot_simd,&sum_tot_simd,puVar10);
            libaom_test::RegisterStateCheckMMX::Check(&reg_check_mmx);
            this = local_480;
            aom_get_var_sse_sum_16x16_dual_c
                      ((local_480->super_GetSseSum16x16DualTest).src_ + lVar11,source_stride,
                       (local_480->super_GetSseSum16x16DualTest).ref_ + lVar11,source_stride,
                       sse16x16,&sse_tot_c,&sum_tot_c,var16x16);
            iVar5 = local_474 + 2;
            var16x16 = var16x16 + 2;
            sse16x16 = sse16x16 + 2;
            puVar10 = local_448 + 2;
            puVar8 = local_440 + 2;
            iVar7 = iVar7 + 0x20;
            lVar11 = lVar11 + 0x20;
          } while (iVar7 < (this->super_GetSseSum16x16DualTest).params_.width);
        }
        lVar6 = local_458 + 0x10;
        lVar11 = local_450 + local_460;
      } while (lVar6 < (this->super_GetSseSum16x16DualTest).params_.height);
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&reg_check_mmx,"sse_tot_c","sse_tot_simd",&sse_tot_c,&sse_tot_simd);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_4c0);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar9 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar9 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x3ef,(char *)pSVar9);
      testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
      testing::internal::AssertHelper::~AssertHelper(&local_4b8);
      if (local_4c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
      }
    }
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&reg_check_mmx,"sum_tot_c","sum_tot_simd",&sum_tot_c,&sum_tot_simd);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_4c0);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar9 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar9 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x3f0,(char *)pSVar9);
      testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
      testing::internal::AssertHelper::~AssertHelper(&local_4b8);
      if (local_4c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
      }
    }
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    lVar6 = 0;
    do {
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"sse1[p]","sse2[p]",(uint *)((long)sse1 + lVar6),
                 (uint *)((long)sse2 + lVar6));
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4c0);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar9 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar9 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f2,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        if (local_4c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
        }
      }
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar1 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar1 != puVar1 + 2) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"sse_tot_simd","sse_tot_c",&sse_tot_simd,&sse_tot_c);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4c0);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar9 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar9 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f3,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        if (local_4c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
        }
      }
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar1 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar1 != puVar1 + 2) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&reg_check_mmx,"sum_tot_simd","sum_tot_c",&sum_tot_simd,&sum_tot_c);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4c0);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar9 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar9 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f4,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        if (local_4c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
        }
      }
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar1 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar1 != puVar1 + 2) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"var1[p]","var2[p]",(uint *)((long)var1 + lVar6),
                 (uint *)((long)var2 + lVar6));
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4c0);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar9 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar9 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f5,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        if (local_4c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
        }
      }
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar1 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar1 != puVar1 + 2) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x100);
    local_478 = local_478 + 1;
  } while (local_478 != 10);
  return;
}

Assistant:

TEST_P(GetSseSum16x16DualTest, RefMseSum) { RefTestSseSumDual(); }